

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CrossSiteObject.h
# Opt level: O1

BOOL __thiscall
Js::CrossSiteObject<Js::FunctionWithHomeObj<Js::ScriptFunctionWithInlineCache>_>::SetAccessors
          (CrossSiteObject<Js::FunctionWithHomeObj<Js::ScriptFunctionWithInlineCache>_> *this,
          PropertyId propertyId,Var getter,Var setter,PropertyOperationFlags flags)

{
  BOOL BVar1;
  Var getter_00;
  Var setter_00;
  
  if (getter == (Var)0x0) {
    getter_00 = (Var)0x0;
  }
  else {
    getter_00 = CrossSite::MarshalVar
                          ((((((Type *)((long)&(this->
                                               super_FunctionWithHomeObj<Js::ScriptFunctionWithInlineCache>
                                               ).super_ScriptFunctionWithInlineCache.
                                               super_ScriptFunction.super_ScriptFunctionBase.
                                               super_JavascriptFunction.super_DynamicObject.
                                               super_RecyclableObject + 8))->ptr->javascriptLibrary)
                            .ptr)->super_JavascriptLibraryBase).scriptContext.ptr,getter,false);
  }
  if (setter == (Var)0x0) {
    setter_00 = (Var)0x0;
  }
  else {
    setter_00 = CrossSite::MarshalVar
                          ((((((Type *)((long)&(this->
                                               super_FunctionWithHomeObj<Js::ScriptFunctionWithInlineCache>
                                               ).super_ScriptFunctionWithInlineCache.
                                               super_ScriptFunction.super_ScriptFunctionBase.
                                               super_JavascriptFunction.super_DynamicObject.
                                               super_RecyclableObject + 8))->ptr->javascriptLibrary)
                            .ptr)->super_JavascriptLibraryBase).scriptContext.ptr,setter,false);
  }
  BVar1 = DynamicObject::SetAccessors((DynamicObject *)this,propertyId,getter_00,setter_00,flags);
  return BVar1;
}

Assistant:

BOOL CrossSiteObject<T>::SetAccessors(PropertyId propertyId, Var getter, Var setter, PropertyOperationFlags flags)
    {
        if (getter != nullptr)
        {
            getter = CrossSite::MarshalVar(this->GetScriptContext(), getter);
        }
        if (setter != nullptr)
        {
            setter = CrossSite::MarshalVar(this->GetScriptContext(), setter);
        }
        return __super::SetAccessors(propertyId, getter, setter, flags);
    }